

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O3

int opn2_generateFormat(OPN2_MIDIPlayer *device,int sampleCount,OPN2_UInt8 *out_left,
                       OPN2_UInt8 *out_right,OPNMIDI_AudioFormat *format)

{
  int32_t *__s;
  unsigned_long uVar1;
  double dVar2;
  OPNMIDI_SampleType OVar3;
  OPNMIDIplay *this;
  OPN2 *pOVar4;
  OPNChipBase *pOVar5;
  long *plVar6;
  bool bVar7;
  OPN2_UInt8 OVar8;
  undefined2 uVar9;
  int iVar10;
  undefined4 uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  code *pcVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  undefined4 uVar23;
  double dVar24;
  double s;
  
  uVar18 = sampleCount - (sampleCount >> 0x1f);
  uVar19 = uVar18 & 0xfffffffe;
  iVar10 = 0;
  if (device != (OPN2_MIDIPlayer *)0x0 && -1 < (int)uVar19) {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("player",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x4e8,
                    "int opn2_generateFormat(struct OPN2_MIDIPlayer *, int, OPN2_UInt8 *, OPN2_UInt8 *, const OPNMIDI_AudioFormat *)"
                   );
    }
    if (uVar19 != 0) {
      uVar1 = (this->m_setup).PCM_RATE;
      dVar24 = (double)(uVar18 >> 1) /
               (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      __s = this->m_outBuf;
      uVar15 = 0;
      uVar18 = uVar19;
      do {
        uVar1 = (this->m_setup).PCM_RATE;
        uVar11 = (undefined4)uVar1;
        uVar23 = (undefined4)(uVar1 >> 0x20);
        if (dVar24 <= 0.0) {
          dVar22 = ((double)CONCAT44(0x45300000,uVar23) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
          dVar24 = (double)(uVar18 >> 1) / dVar22;
        }
        else {
          dVar22 = ((double)CONCAT44(0x45300000,uVar23) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0);
        }
        dVar2 = (this->m_setup).maxdelay;
        s = dVar24;
        if (dVar2 <= dVar24) {
          s = dVar2;
        }
        dVar22 = dVar22 * s + (this->m_setup).carry;
        uVar13 = (ulong)dVar22;
        (this->m_setup).carry = dVar22 - (double)(long)uVar13;
        uVar14 = (ulong)(uVar18 >> 1);
        if ((long)uVar13 < (long)(ulong)(uVar18 >> 1)) {
          uVar14 = uVar13;
        }
        uVar13 = 0x200;
        if ((long)uVar14 < 0x200) {
          uVar13 = uVar14;
        }
        memset(__s,0,uVar13 * 8);
        pOVar4 = (this->m_synth).m_p;
        uVar17 = (ulong)pOVar4->m_numChips;
        if (uVar17 == 1) {
          pOVar5 = ((pOVar4->m_chips).
                    super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_p;
          (*pOVar5->_vptr_OPNChipBase[0x12])(pOVar5,__s,uVar13);
        }
        else if (uVar17 != 0) {
          lVar21 = 0;
          do {
            plVar6 = *(long **)((long)&((pOVar4->m_chips).
                                        super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar21);
            (**(code **)(*plVar6 + 0x98))(plVar6,__s,uVar13);
            lVar21 = lVar21 + 0x10;
          } while (uVar17 << 4 != lVar21);
        }
        uVar13 = uVar13 * 2;
        if (uVar14 != 0) {
          uVar14 = uVar19 - uVar15;
          if (uVar13 < uVar19 - uVar15) {
            uVar14 = uVar13;
          }
          OVar3 = format->type;
          if (OPNMIDI_SampleType_U32 < OVar3) {
            return 0;
          }
          uVar12 = format->containerSize;
          uVar17 = (ulong)format->sampleOffset;
          lVar21 = (uVar15 >> 1) * uVar17;
          switch(OVar3) {
          default:
            if (uVar12 == 4) {
              if (1 < uVar14) {
                uVar20 = 0;
                do {
                  *(int32_t *)(out_left + lVar21) = this->m_outBuf[uVar20 * 2];
                  *(int32_t *)(out_right + lVar21) = this->m_outBuf[uVar20 * 2 + 1];
                  uVar20 = uVar20 + 1;
                  lVar21 = lVar21 + uVar17;
                } while (uVar14 >> 1 != uVar20);
              }
            }
            else {
              if (uVar12 != 2) {
                return 0;
              }
              pcVar16 = opn2_cvtU16;
              if (OVar3 == OPNMIDI_SampleType_S16) {
                pcVar16 = opn2_cvtS16;
              }
              if (1 < uVar14) {
                uVar20 = 0;
                do {
                  uVar9 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                  *(undefined2 *)(out_left + lVar21) = uVar9;
                  uVar9 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                  *(undefined2 *)(out_right + lVar21) = uVar9;
                  uVar20 = uVar20 + 1;
                  lVar21 = lVar21 + uVar17;
                } while (uVar14 >> 1 != uVar20);
              }
            }
            break;
          case OPNMIDI_SampleType_S8:
          case OPNMIDI_SampleType_U8:
            pcVar16 = opn2_cvtU8;
            if (OVar3 == OPNMIDI_SampleType_S8) {
              pcVar16 = opn2_cvtS8;
            }
            if (uVar12 == 4) {
              if (1 < uVar14) {
                uVar20 = 0;
                do {
                  uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                  *(undefined4 *)(out_left + lVar21) = uVar11;
                  uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                  *(undefined4 *)(out_right + lVar21) = uVar11;
                  uVar20 = uVar20 + 1;
                  lVar21 = lVar21 + uVar17;
                } while (uVar14 >> 1 != uVar20);
              }
            }
            else if (uVar12 == 2) {
              if (1 < uVar14) {
                uVar20 = 0;
                do {
                  uVar9 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                  *(undefined2 *)(out_left + lVar21) = uVar9;
                  uVar9 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                  *(undefined2 *)(out_right + lVar21) = uVar9;
                  uVar20 = uVar20 + 1;
                  lVar21 = lVar21 + uVar17;
                } while (uVar14 >> 1 != uVar20);
              }
            }
            else {
              if (uVar12 != 1) {
                return 0;
              }
              if (1 < uVar14) {
                uVar20 = 0;
                do {
                  OVar8 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                  out_left[lVar21] = OVar8;
                  OVar8 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                  out_right[lVar21] = OVar8;
                  uVar20 = uVar20 + 1;
                  lVar21 = lVar21 + uVar17;
                } while (uVar14 >> 1 != uVar20);
              }
            }
            break;
          case OPNMIDI_SampleType_F32:
            if (uVar12 != 4) {
              return 0;
            }
            if (1 < uVar14) {
              uVar20 = 0;
              do {
                *(float *)(out_left + lVar21) = (float)this->m_outBuf[uVar20 * 2] * 3.051851e-05;
                *(float *)(out_right + lVar21) =
                     (float)this->m_outBuf[uVar20 * 2 + 1] * 3.051851e-05;
                uVar20 = uVar20 + 1;
                lVar21 = lVar21 + uVar17;
              } while (uVar14 >> 1 != uVar20);
            }
            break;
          case OPNMIDI_SampleType_F64:
            if (uVar12 != 8) {
              return 0;
            }
            if (1 < uVar14) {
              uVar20 = 0;
              do {
                *(double *)(out_left + lVar21) =
                     (double)this->m_outBuf[uVar20 * 2] * 3.051850947599719e-05;
                *(double *)(out_right + lVar21) =
                     (double)this->m_outBuf[uVar20 * 2 + 1] * 3.051850947599719e-05;
                uVar20 = uVar20 + 1;
                lVar21 = lVar21 + uVar17;
              } while (uVar14 >> 1 != uVar20);
            }
            break;
          case OPNMIDI_SampleType_S24:
          case OPNMIDI_SampleType_U24:
            if (uVar12 != 4) {
              return 0;
            }
            pcVar16 = opn2_cvtU24;
            if (OVar3 == OPNMIDI_SampleType_S24) {
              pcVar16 = opn2_cvtS24;
            }
            if (1 < uVar14) {
              uVar20 = 0;
              do {
                uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                *(undefined4 *)(out_left + lVar21) = uVar11;
                uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                *(undefined4 *)(out_right + lVar21) = uVar11;
                uVar20 = uVar20 + 1;
                lVar21 = lVar21 + uVar17;
              } while (uVar14 >> 1 != uVar20);
            }
            break;
          case OPNMIDI_SampleType_S32:
          case OPNMIDI_SampleType_U32:
            if (uVar12 != 4) {
              return 0;
            }
            pcVar16 = opn2_cvtU32;
            if (OVar3 == OPNMIDI_SampleType_S32) {
              pcVar16 = opn2_cvtS32;
            }
            if (1 < uVar14) {
              uVar20 = 0;
              do {
                uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2]);
                *(undefined4 *)(out_left + lVar21) = uVar11;
                uVar11 = (*pcVar16)(this->m_outBuf[uVar20 * 2 + 1]);
                *(undefined4 *)(out_right + lVar21) = uVar11;
                uVar20 = uVar20 + 1;
                lVar21 = lVar21 + uVar17;
              } while (uVar14 >> 1 != uVar20);
            }
          }
        }
        dVar24 = dVar24 - s;
        uVar15 = uVar15 + uVar13;
        OPNMIDIplay::TickIterators(this,s);
        uVar12 = uVar18 - (int)uVar13;
        bVar7 = (int)uVar13 <= (int)uVar18;
        uVar18 = uVar12;
      } while (uVar12 != 0 && bVar7);
      iVar10 = (int)uVar15;
    }
  }
  return iVar10;
}

Assistant:

OPNMIDI_EXPORT int opn2_generateFormat(struct OPN2_MIDIPlayer *device, int sampleCount,
                                       OPN2_UInt8 *out_left, OPN2_UInt8 *out_right,
                                       const OPNMIDI_AudioFormat *format)
{
    sampleCount -= sampleCount % 2; //Avoid even sample requests
    if(sampleCount < 0)
        return 0;
    if(!device)
        return 0;

    MidiPlayer *player = GET_MIDI_PLAYER(device);
    assert(player);
    MidiPlayer::Setup &setup = player->m_setup;

    ssize_t gotten_len = 0;
    ssize_t n_periodCountStereo = 512;

    int     left = sampleCount;
    double  delay = double(sampleCount / 2) / double(setup.PCM_RATE);

    while(left > 0)
    {
        if(delay <= 0.0)
            delay = double(left / 2) / double(setup.PCM_RATE);
        const double eat_delay = delay < setup.maxdelay ? delay : setup.maxdelay;
        delay -= eat_delay;
        setup.carry += double(setup.PCM_RATE) * eat_delay;
        n_periodCountStereo = static_cast<ssize_t>(setup.carry);
        setup.carry -= double(n_periodCountStereo);

        {
            ssize_t leftSamples = left / 2;
            if(n_periodCountStereo > leftSamples)
                n_periodCountStereo = leftSamples;
            //! Count of stereo samples
            ssize_t in_generatedStereo = (n_periodCountStereo > 512) ? 512 : n_periodCountStereo;
            //! Total count of samples
            ssize_t in_generatedPhys = in_generatedStereo * 2;
            //! Unsigned total sample count
            //fill buffer with zeros
            int32_t *out_buf = player->m_outBuf;
            std::memset(out_buf, 0, static_cast<size_t>(in_generatedPhys) * sizeof(out_buf[0]));
            Synth &synth = *player->m_synth;
            unsigned int chips = synth.m_numChips;
            if(chips == 1)
                synth.m_chips[0]->generate32(out_buf, (size_t)in_generatedStereo);
            else/* if(n_periodCountStereo > 0)*/
            {
                /* Generate data from every chip and mix result */
                for(size_t card = 0; card < chips; ++card)
                    synth.m_chips[card]->generateAndMix32(out_buf, (size_t)in_generatedStereo);
            }
            /* Process it */
            if(SendStereoAudio(sampleCount, in_generatedStereo, out_buf, gotten_len, out_left, out_right, format) == -1)
                return 0;

            left -= (int)in_generatedPhys;
            gotten_len += (in_generatedPhys) /* - setup.stored_samples*/;
        }

        player->TickIterators(eat_delay);
    }

    return static_cast<int>(gotten_len);
}